

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebugger.cxx
# Opt level: O2

void __thiscall cmDebugger_impl::PauseExecution(cmDebugger_impl *this)

{
  LOCK();
  (this->breakPending)._M_base._M_i = false;
  UNLOCK();
  this->breakDepth = -1;
  LOCK();
  (this->continuePending)._M_base._M_i = false;
  UNLOCK();
  SetState(this,Paused);
  if (((this->continuePending)._M_base._M_i & 1U) == 0) {
    std::_V2::condition_variable_any::
    wait<std::unique_lock<std::recursive_timed_mutex>,cmDebugger_impl::PauseExecution()::_lambda()_1_>
              (&this->cv,&this->Lock,(anon_class_8_1_8991fb9c)this);
  }
  SetState(this,Running);
  return;
}

Assistant:

void PauseExecution()
  {
    breakPending = false;
    breakDepth = -1;
    continuePending = false;
    SetState(State::Paused);

    if (!continuePending) {
      cv.wait(Lock, [this] { return (bool)continuePending; });
    }
    SetState(State::Running);
  }